

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_wiznet(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  char *txt;
  int iVar6;
  double dVar7;
  char buf [4608];
  
  if (*argument == '\0') {
    if ((ch->wiznet[0] & 1) == 0) {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      uVar4 = ch->wiznet[0] | 1;
    }
    else {
      send_to_char("Signing off of Wiznet.\n\r",ch);
      uVar4 = ch->wiznet[0] & 0xfffffffffffffffe;
    }
    ch->wiznet[0] = uVar4;
  }
  else {
    bVar1 = str_prefix(argument,"on");
    if (bVar1) {
      bVar1 = str_prefix(argument,"off");
      if (bVar1) {
        bVar1 = str_prefix(argument,"status");
        if (bVar1) {
          bVar1 = str_prefix(argument,"show");
          if (bVar1) {
            lVar3 = wiznet_lookup(argument);
            iVar6 = (int)lVar3;
            if (iVar6 != -1) {
              iVar2 = get_trust(ch);
              if (wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar6].level <= iVar2) {
                uVar4 = ch->wiznet
                        [wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar6].flag / 0x20];
                dVar7 = ldexp(1.0,wiznet_table.
                                  super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar6].flag % 0x20);
                if ((uVar4 & (long)dVar7) != 0) {
                  sprintf(buf,"You will no longer see %s on wiznet.\n\r",
                          wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar6].name);
                  send_to_char(buf,ch);
                  dVar7 = ldexp(1.0,wiznet_table.
                                    super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar6].flag % 0x20);
                  ch->wiznet
                  [wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar6].flag / 0x20] =
                       ch->wiznet
                       [wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar6].flag / 0x20] & ~(long)dVar7;
                  return;
                }
                sprintf(buf,"You will now see %s on wiznet.\n\r",
                        wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar6].name);
                send_to_char(buf,ch);
                dVar7 = ldexp(1.0,wiznet_table.
                                  super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar6].flag % 0x20);
                ch->wiznet
                [wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar6].flag / 0x20] =
                     ch->wiznet
                     [wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar6].flag / 0x20] | (long)dVar7;
                return;
              }
            }
            send_to_char("No such option.\n\r",ch);
            return;
          }
          buf[0] = '\0';
          for (lVar3 = 0;
              *(long *)((long)&(wiznet_table.
                                super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name + lVar3) != 0;
              lVar3 = lVar3 + 0x10) {
            iVar6 = *(int *)((long)&(wiznet_table.
                                     super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->level + lVar3);
            iVar2 = get_trust(ch);
            if (iVar6 <= iVar2) {
              strcat(buf,*(char **)((long)&(wiznet_table.
                                            super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name + lVar3
                                   ));
              sVar5 = strlen(buf);
              (buf + sVar5)[0] = ' ';
              (buf + sVar5)[1] = '\0';
            }
          }
          sVar5 = strlen(buf);
          (buf + sVar5)[0] = '\n';
          (buf + sVar5)[1] = '\r';
          buf[sVar5 + 2] = '\0';
          txt = "Wiznet options available to you are:\n\r";
        }
        else {
          buf[0] = '\0';
          if ((ch->wiznet[0] & 1) == 0) {
            sVar5 = strlen(buf);
            builtin_strncpy(buf + sVar5,"off ",5);
          }
          for (lVar3 = 0;
              *(long *)((long)&(wiznet_table.
                                super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name + lVar3) != 0;
              lVar3 = lVar3 + 0x10) {
            iVar6 = *(int *)((long)&(wiznet_table.
                                     super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->flag + lVar3);
            uVar4 = ch->wiznet[iVar6 / 0x20];
            dVar7 = ldexp(1.0,iVar6 % 0x20);
            if ((uVar4 & (long)dVar7) != 0) {
              strcat(buf,*(char **)((long)&(wiznet_table.
                                            super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name + lVar3
                                   ));
              sVar5 = strlen(buf);
              (buf + sVar5)[0] = ' ';
              (buf + sVar5)[1] = '\0';
            }
          }
          sVar5 = strlen(buf);
          (buf + sVar5)[0] = '\n';
          (buf + sVar5)[1] = '\r';
          buf[sVar5 + 2] = '\0';
          txt = "Wiznet status:\n\r";
        }
        send_to_char(txt,ch);
        send_to_char(buf,ch);
      }
      else {
        send_to_char("Signing off of Wiznet.\n\r",ch);
        *(byte *)ch->wiznet = (byte)ch->wiznet[0] & 0xfe;
      }
    }
    else {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      *(byte *)ch->wiznet = (byte)ch->wiznet[0] | 1;
    }
  }
  return;
}

Assistant:

void do_wiznet(CHAR_DATA *ch, char *argument)
{
	int flag;
	char buf[MAX_STRING_LENGTH];

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->wiznet, WIZ_ON))
		{
			send_to_char("Signing off of Wiznet.\n\r", ch);
			REMOVE_BIT(ch->wiznet, WIZ_ON);
		}
		else
		{
			send_to_char("Welcome to Wiznet!\n\r", ch);
			SET_BIT(ch->wiznet, WIZ_ON);
		}

		return;
	}

	if (!str_prefix(argument, "on"))
	{
		send_to_char("Welcome to Wiznet!\n\r", ch);
		SET_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	if (!str_prefix(argument, "off"))
	{
		send_to_char("Signing off of Wiznet.\n\r", ch);
		REMOVE_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	/* show wiznet status */
	if (!str_prefix(argument, "status"))
	{
		buf[0] = '\0';

		if (!IS_SET(ch->wiznet, WIZ_ON))
			strcat(buf, "off ");

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet status:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	/* list of all wiznet options */
	if (!str_prefix(argument, "show"))
	{
		buf[0] = '\0';

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (wiznet_table[flag].level <= get_trust(ch))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet options available to you are:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	flag = wiznet_lookup(argument);

	if (flag == -1 || get_trust(ch) < wiznet_table[flag].level)
	{
		send_to_char("No such option.\n\r", ch);
		return;
	}

	if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
	{
		sprintf(buf, "You will no longer see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		REMOVE_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
	else
	{
		sprintf(buf, "You will now see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		SET_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
}